

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

bool __thiscall
GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::Find
          (MI<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight,
          iterator *pos)

{
  bool bVar1;
  _List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> _Var2;
  _Self *in_RDX;
  MP<8UL,_GF2::MOGrevlex<8UL>_> poly;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffff30;
  bool local_c1;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffff40;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_ffffffffffffff48;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *__val;
  _List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> in_stack_ffffffffffffff50;
  _List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> in_stack_ffffffffffffff58;
  bool local_99;
  _Self local_90 [3];
  _List_node_base *local_78;
  _List_node_base *local_70;
  _List_node_base *local_68;
  MP<8UL,_GF2::MOGrevlex<8UL>_> local_60;
  _Self local_40;
  _List_node_base *local_38;
  _List_node_base *local_30;
  _List_node_base *local_28;
  _Self *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  bVar1 = IsConsistent((MI<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_ffffffffffffff30,
                       (MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                       CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  if (bVar1) {
    local_30 = (_List_node_base *)
               std::__cxx11::
               list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ::begin((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    local_38 = (_List_node_base *)
               std::__cxx11::
               list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    local_28 = (_List_node_base *)
               std::
               lower_bound<std::_List_iterator<GF2::MP<8ul,GF2::MOGrevlex<8ul>>>,GF2::MP<8ul,GF2::MOGrevlex<8ul>>>
                         (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff48);
    local_20->_M_node = local_28;
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
         ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    bVar1 = std::operator!=(local_20,&local_40);
    local_99 = false;
    if (bVar1) {
      std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
                ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cc01b);
      local_99 = MP<8UL,_GF2::MOGrevlex<8UL>_>::operator==
                           (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
    local_1 = local_99;
  }
  else {
    __val = &local_60;
    MP<8UL,_GF2::MOGrevlex<8UL>_>::MP
              (in_stack_ffffffffffffff30,
               (MOGrevlex<8UL> *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    local_70 = (_List_node_base *)
               std::__cxx11::
               list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ::begin((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    local_78 = (_List_node_base *)
               std::__cxx11::
               list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    _Var2._M_node =
         (_List_node_base *)
         MP<8UL,_GF2::MOGrevlex<8UL>_>::operator=
                   (in_stack_ffffffffffffff30,
                    (MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                    CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    _Var2 = std::
            lower_bound<std::_List_iterator<GF2::MP<8ul,GF2::MOGrevlex<8ul>>>,GF2::MP<8ul,GF2::MOGrevlex<8ul>>>
                      (in_stack_ffffffffffffff58,_Var2,__val);
    local_20->_M_node = _Var2._M_node;
    local_68 = _Var2._M_node;
    local_90[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
         ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    bVar1 = std::operator!=(local_20,local_90);
    local_c1 = false;
    if (bVar1) {
      std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
                ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cc10c);
      local_c1 = MP<8UL,_GF2::MOGrevlex<8UL>_>::operator==
                           (__val,(MP<8UL,_GF2::MOGrevlex<8UL>_> *)_Var2._M_node);
    }
    local_1 = local_c1;
    MP<8UL,_GF2::MOGrevlex<8UL>_>::~MP((MP<8UL,_GF2::MOGrevlex<8UL>_> *)0x1cc140);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Find(const MP<_n, _O>& polyRight, iterator& pos)
	{
		if (IsConsistent(polyRight))
		{
			pos = std::lower_bound(begin(), end(), polyRight);
			return pos != end() && *pos == polyRight;
		}
		// сравнение несогласованных многочленов неэффективно,
		// поэтому сразу меняем порядок
		MP<_n, _O> poly(_order);
		pos = std::lower_bound(begin(), end(), poly = polyRight);
		return pos != end() && *pos == poly;
	}